

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  Scene *pSVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar23;
  int iVar24;
  AABBNodeMB4D *node1;
  ulong uVar25;
  byte bVar26;
  byte bVar27;
  ulong uVar28;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  uint uVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar48;
  StackItemT<embree::NodeRefPtr<4>_> SVar49;
  StackItemT<embree::NodeRefPtr<4>_> SVar50;
  StackItemT<embree::NodeRefPtr<4>_> SVar51;
  StackItemT<embree::NodeRefPtr<4>_> SVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar100 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  StackItemT<embree::NodeRefPtr<4>_> *local_1218;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  long local_11d8;
  ulong local_11d0;
  ulong local_11c8;
  ulong local_11c0;
  ulong local_11b8;
  ulong local_11b0;
  size_t local_11a8;
  long local_11a0;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  float local_1068 [4];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint uStack_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  local_1218 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  local_1018 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1028 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1038 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)(local_1018 * 0.99999964)));
  auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)(local_1028 * 0.99999964)));
  auVar44 = vbroadcastss_avx512vl(ZEXT416((uint)(local_1038 * 0.99999964)));
  local_1018 = local_1018 * 1.0000004;
  local_1028 = local_1028 * 1.0000004;
  local_1038 = local_1038 * 1.0000004;
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_11b0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_11b8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_11c0 = uVar32 ^ 0x10;
  local_11c8 = local_11b0 ^ 0x10;
  local_11d0 = local_11b8 ^ 0x10;
  iVar24 = (tray->tnear).field_0.i[k];
  local_1048._4_4_ = iVar24;
  local_1048._0_4_ = iVar24;
  local_1048._8_4_ = iVar24;
  local_1048._12_4_ = iVar24;
  auVar100 = ZEXT1664(local_1048);
  iVar24 = (tray->tfar).field_0.i[k];
  auVar76 = ZEXT1664(CONCAT412(iVar24,CONCAT48(iVar24,CONCAT44(iVar24,iVar24))));
  local_1058 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  local_11a8 = k;
  uVar30 = local_11b0;
  uVar31 = local_11c8;
  uVar38 = local_11d0;
  uVar34 = local_11b8;
  uVar35 = local_11c0;
  fVar86 = local_1018;
  fVar87 = local_1018;
  fVar88 = local_1018;
  fVar89 = local_1018;
  fVar90 = local_1028;
  fVar93 = local_1028;
  fVar94 = local_1028;
  fVar95 = local_1028;
  fVar96 = local_1038;
  fVar97 = local_1038;
  fVar98 = local_1038;
  fVar99 = local_1038;
  do {
    do {
      do {
        if (local_1218 == stack) {
          return;
        }
        pSVar23 = local_1218 + -1;
        local_1218 = local_1218 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar23->dist);
      sVar29 = (local_1218->ptr).ptr;
      do {
        if ((sVar29 & 8) == 0) {
          uVar25 = sVar29 & 0xfffffffffffffff0;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar68._4_4_ = uVar1;
          auVar68._0_4_ = uVar1;
          auVar68._8_4_ = uVar1;
          auVar68._12_4_ = uVar1;
          auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar32),auVar68,
                                    *(undefined1 (*) [16])(uVar25 + 0x20 + uVar32));
          auVar45 = vsubps_avx512vl(auVar45,auVar39);
          auVar45 = vmulps_avx512vl(auVar42,auVar45);
          auVar45 = vmaxps_avx(auVar100._0_16_,auVar45);
          auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar30),auVar68,
                                    *(undefined1 (*) [16])(uVar25 + 0x20 + uVar30));
          auVar46 = vsubps_avx512vl(auVar46,auVar40);
          auVar47 = vmulps_avx512vl(auVar43,auVar46);
          auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar34),auVar68,
                                    *(undefined1 (*) [16])(uVar25 + 0x20 + uVar34));
          auVar46 = vsubps_avx512vl(auVar46,auVar41);
          auVar46 = vmulps_avx512vl(auVar44,auVar46);
          auVar46 = vmaxps_avx(auVar47,auVar46);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar45,auVar46)
          ;
          auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar35),auVar68,
                                    *(undefined1 (*) [16])(uVar25 + 0x20 + uVar35));
          auVar45 = vsubps_avx512vl(auVar45,auVar39);
          auVar46._0_4_ = fVar86 * auVar45._0_4_;
          auVar46._4_4_ = fVar87 * auVar45._4_4_;
          auVar46._8_4_ = fVar88 * auVar45._8_4_;
          auVar46._12_4_ = fVar89 * auVar45._12_4_;
          auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar31),auVar68,
                                    *(undefined1 (*) [16])(uVar25 + 0x20 + uVar31));
          auVar45 = vsubps_avx512vl(auVar45,auVar40);
          auVar47._0_4_ = fVar90 * auVar45._0_4_;
          auVar47._4_4_ = fVar93 * auVar45._4_4_;
          auVar47._8_4_ = fVar94 * auVar45._8_4_;
          auVar47._12_4_ = fVar95 * auVar45._12_4_;
          auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar38),auVar68,
                                    *(undefined1 (*) [16])(uVar25 + 0x20 + uVar38));
          auVar45 = vsubps_avx512vl(auVar45,auVar41);
          auVar58._0_4_ = fVar96 * auVar45._0_4_;
          auVar58._4_4_ = fVar97 * auVar45._4_4_;
          auVar58._8_4_ = fVar98 * auVar45._8_4_;
          auVar58._12_4_ = fVar99 * auVar45._12_4_;
          auVar45 = vminps_avx(auVar47,auVar58);
          auVar46 = vminps_avx(auVar76._0_16_,auVar46);
          auVar45 = vminps_avx(auVar46,auVar45);
          local_11a8 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar45,2);
          if (((uint)sVar29 & 7) == 6) {
            uVar10 = vcmpps_avx512vl(auVar68,*(undefined1 (*) [16])(uVar25 + 0xf0),1);
            uVar11 = vcmpps_avx512vl(auVar68,*(undefined1 (*) [16])(uVar25 + 0xe0),0xd);
            local_11a8 = (size_t)(byte)((byte)uVar10 & (byte)uVar11 & (byte)local_11a8);
          }
        }
        if ((sVar29 & 8) == 0) {
          if (local_11a8 == 0) {
            iVar24 = 4;
          }
          else {
            uVar28 = sVar29 & 0xfffffffffffffff0;
            lVar33 = 0;
            for (uVar25 = local_11a8; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000)
            {
              lVar33 = lVar33 + 1;
            }
            iVar24 = 0;
            uVar25 = local_11a8 - 1 & local_11a8;
            sVar29 = *(ulong *)(uVar28 + lVar33 * 8);
            if (uVar25 != 0) {
              uVar37 = tNear.field_0.i[lVar33];
              lVar33 = 0;
              for (uVar13 = uVar25; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                lVar33 = lVar33 + 1;
              }
              uVar25 = uVar25 - 1 & uVar25;
              uVar13 = *(ulong *)(uVar28 + lVar33 * 8);
              uVar3 = tNear.field_0.i[lVar33];
              if (uVar25 == 0) {
                if (uVar37 < uVar3) {
                  (local_1218->ptr).ptr = uVar13;
                  local_1218->dist = uVar3;
                  local_1218 = local_1218 + 1;
                }
                else {
                  (local_1218->ptr).ptr = sVar29;
                  local_1218->dist = uVar37;
                  sVar29 = uVar13;
                  local_1218 = local_1218 + 1;
                }
              }
              else {
                auVar45._8_8_ = 0;
                auVar45._0_8_ = sVar29;
                auVar45 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar37));
                auVar59._8_8_ = 0;
                auVar59._0_8_ = uVar13;
                auVar46 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar3));
                lVar33 = 0;
                for (uVar13 = uVar25; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
                {
                  lVar33 = lVar33 + 1;
                }
                uVar25 = uVar25 - 1 & uVar25;
                auVar60._8_8_ = 0;
                auVar60._0_8_ = *(ulong *)(uVar28 + lVar33 * 8);
                auVar59 = vpunpcklqdq_avx(auVar60,ZEXT416((uint)tNear.field_0.i[lVar33]));
                auVar47 = vpshufd_avx(auVar45,0xaa);
                auVar68 = vpshufd_avx(auVar46,0xaa);
                auVar58 = vpshufd_avx(auVar59,0xaa);
                if (uVar25 == 0) {
                  uVar25 = vpcmpgtd_avx512vl(auVar68,auVar47);
                  uVar25 = uVar25 & 0xf;
                  auVar68 = vpblendmd_avx512vl(auVar46,auVar45);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  auVar64._0_4_ = (uint)bVar7 * auVar68._0_4_ | (uint)!bVar7 * auVar47._0_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar64._4_4_ = (uint)bVar7 * auVar68._4_4_ | (uint)!bVar7 * auVar47._4_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar64._8_4_ = (uint)bVar7 * auVar68._8_4_ | (uint)!bVar7 * auVar47._8_4_;
                  bVar7 = SUB81(uVar25 >> 3,0);
                  auVar64._12_4_ = (uint)bVar7 * auVar68._12_4_ | (uint)!bVar7 * auVar47._12_4_;
                  auVar46 = vmovdqa32_avx512vl(auVar46);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  auVar65._0_4_ = (uint)bVar7 * auVar46._0_4_ | (uint)!bVar7 * auVar45._0_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar65._4_4_ = (uint)bVar7 * auVar46._4_4_ | (uint)!bVar7 * auVar45._4_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar65._8_4_ = (uint)bVar7 * auVar46._8_4_ | (uint)!bVar7 * auVar45._8_4_;
                  bVar7 = SUB81(uVar25 >> 3,0);
                  auVar65._12_4_ = (uint)bVar7 * auVar46._12_4_ | (uint)!bVar7 * auVar45._12_4_;
                  auVar45 = vpshufd_avx(auVar64,0xaa);
                  uVar25 = vpcmpgtd_avx512vl(auVar58,auVar45);
                  uVar25 = uVar25 & 0xf;
                  auVar46 = vpblendmd_avx512vl(auVar59,auVar64);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  bVar8 = (bool)((byte)(uVar25 >> 1) & 1);
                  sVar29 = CONCAT44((uint)bVar8 * auVar46._4_4_ | (uint)!bVar8 * auVar45._4_4_,
                                    (uint)bVar7 * auVar46._0_4_ | (uint)!bVar7 * auVar45._0_4_);
                  auVar45 = vmovdqa32_avx512vl(auVar59);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  auVar66._0_4_ = (uint)bVar7 * auVar45._0_4_ | !bVar7 * auVar64._0_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar66._4_4_ = (uint)bVar7 * auVar45._4_4_ | !bVar7 * auVar64._4_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar66._8_4_ = (uint)bVar7 * auVar45._8_4_ | !bVar7 * auVar64._8_4_;
                  bVar7 = SUB81(uVar25 >> 3,0);
                  auVar66._12_4_ = (uint)bVar7 * auVar45._12_4_ | !bVar7 * auVar64._12_4_;
                  auVar45 = vpshufd_avx(auVar66,0xaa);
                  auVar46 = vpshufd_avx(auVar65,0xaa);
                  uVar25 = vpcmpgtd_avx512vl(auVar45,auVar46);
                  uVar25 = uVar25 & 0xf;
                  auVar46 = vpblendmd_avx512vl(auVar66,auVar65);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  SVar48.ptr.ptr._0_4_ = (uint)bVar7 * auVar46._0_4_ | (uint)!bVar7 * auVar45._0_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                  SVar48.ptr.ptr._4_4_ = (uint)bVar7 * auVar46._4_4_ | (uint)!bVar7 * auVar45._4_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                  SVar48.dist = (uint)bVar7 * auVar46._8_4_ | (uint)!bVar7 * auVar45._8_4_;
                  bVar7 = SUB81(uVar25 >> 3,0);
                  SVar48._12_4_ = (uint)bVar7 * auVar46._12_4_ | (uint)!bVar7 * auVar45._12_4_;
                  auVar45 = vmovdqa32_avx512vl(auVar66);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  SVar49.ptr.ptr._0_4_ = (uint)bVar7 * auVar45._0_4_ | !bVar7 * auVar65._0_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                  SVar49.ptr.ptr._4_4_ = (uint)bVar7 * auVar45._4_4_ | !bVar7 * auVar65._4_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                  SVar49.dist = (uint)bVar7 * auVar45._8_4_ | !bVar7 * auVar65._8_4_;
                  bVar7 = SUB81(uVar25 >> 3,0);
                  SVar49._12_4_ = (uint)bVar7 * auVar45._12_4_ | !bVar7 * auVar65._12_4_;
                  *local_1218 = SVar49;
                  local_1218[1] = SVar48;
                  local_1218 = local_1218 + 2;
                }
                else {
                  lVar33 = 0;
                  for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                    lVar33 = lVar33 + 1;
                  }
                  uVar37 = tNear.field_0.i[lVar33];
                  auVar63._8_8_ = 0;
                  auVar63._0_8_ = *(ulong *)(uVar28 + lVar33 * 8);
                  auVar60 = vpunpcklqdq_avx(auVar63,ZEXT416(uVar37));
                  uVar25 = vpcmpgtd_avx512vl(auVar68,auVar47);
                  uVar25 = uVar25 & 0xf;
                  auVar68 = vpblendmd_avx512vl(auVar46,auVar45);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  auVar61._0_4_ = (uint)bVar7 * auVar68._0_4_ | (uint)!bVar7 * auVar47._0_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar61._4_4_ = (uint)bVar7 * auVar68._4_4_ | (uint)!bVar7 * auVar47._4_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar61._8_4_ = (uint)bVar7 * auVar68._8_4_ | (uint)!bVar7 * auVar47._8_4_;
                  bVar7 = SUB81(uVar25 >> 3,0);
                  auVar61._12_4_ = (uint)bVar7 * auVar68._12_4_ | (uint)!bVar7 * auVar47._12_4_;
                  auVar46 = vmovdqa32_avx512vl(auVar46);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  auVar62._0_4_ = (uint)bVar7 * auVar46._0_4_ | (uint)!bVar7 * auVar45._0_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar62._4_4_ = (uint)bVar7 * auVar46._4_4_ | (uint)!bVar7 * auVar45._4_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar62._8_4_ = (uint)bVar7 * auVar46._8_4_ | (uint)!bVar7 * auVar45._8_4_;
                  bVar7 = SUB81(uVar25 >> 3,0);
                  auVar62._12_4_ = (uint)bVar7 * auVar46._12_4_ | (uint)!bVar7 * auVar45._12_4_;
                  auVar57._4_4_ = uVar37;
                  auVar57._0_4_ = uVar37;
                  auVar57._8_4_ = uVar37;
                  auVar57._12_4_ = uVar37;
                  uVar25 = vpcmpgtd_avx512vl(auVar57,auVar58);
                  uVar25 = uVar25 & 0xf;
                  auVar45 = vpblendmd_avx512vl(auVar60,auVar59);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  auVar53._0_4_ = (uint)bVar7 * auVar45._0_4_ | !bVar7 * uVar37;
                  bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar53._4_4_ = (uint)bVar7 * auVar45._4_4_ | !bVar7 * uVar37;
                  bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar53._8_4_ = (uint)bVar7 * auVar45._8_4_ | !bVar7 * uVar37;
                  bVar7 = SUB81(uVar25 >> 3,0);
                  auVar53._12_4_ = (uint)bVar7 * auVar45._12_4_ | !bVar7 * uVar37;
                  auVar45 = vmovdqa32_avx512vl(auVar60);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  auVar54._0_4_ = (uint)bVar7 * auVar45._0_4_ | (uint)!bVar7 * auVar59._0_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar54._4_4_ = (uint)bVar7 * auVar45._4_4_ | (uint)!bVar7 * auVar59._4_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar54._8_4_ = (uint)bVar7 * auVar45._8_4_ | (uint)!bVar7 * auVar59._8_4_;
                  bVar7 = SUB81(uVar25 >> 3,0);
                  auVar54._12_4_ = (uint)bVar7 * auVar45._12_4_ | (uint)!bVar7 * auVar59._12_4_;
                  auVar45 = vpshufd_avx(auVar54,0xaa);
                  auVar46 = vpshufd_avx(auVar62,0xaa);
                  uVar25 = vpcmpgtd_avx512vl(auVar45,auVar46);
                  uVar25 = uVar25 & 0xf;
                  auVar46 = vpblendmd_avx512vl(auVar54,auVar62);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  auVar55._0_4_ = (uint)bVar7 * auVar46._0_4_ | (uint)!bVar7 * auVar45._0_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar55._4_4_ = (uint)bVar7 * auVar46._4_4_ | (uint)!bVar7 * auVar45._4_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar55._8_4_ = (uint)bVar7 * auVar46._8_4_ | (uint)!bVar7 * auVar45._8_4_;
                  bVar7 = SUB81(uVar25 >> 3,0);
                  auVar55._12_4_ = (uint)bVar7 * auVar46._12_4_ | (uint)!bVar7 * auVar45._12_4_;
                  auVar45 = vmovdqa32_avx512vl(auVar54);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  SVar50.ptr.ptr._0_4_ = (uint)bVar7 * auVar45._0_4_ | !bVar7 * auVar62._0_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                  SVar50.ptr.ptr._4_4_ = (uint)bVar7 * auVar45._4_4_ | !bVar7 * auVar62._4_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                  SVar50.dist = (uint)bVar7 * auVar45._8_4_ | !bVar7 * auVar62._8_4_;
                  bVar7 = SUB81(uVar25 >> 3,0);
                  SVar50._12_4_ = (uint)bVar7 * auVar45._12_4_ | !bVar7 * auVar62._12_4_;
                  auVar45 = vpshufd_avx(auVar53,0xaa);
                  auVar46 = vpshufd_avx(auVar61,0xaa);
                  uVar25 = vpcmpgtd_avx512vl(auVar45,auVar46);
                  uVar25 = uVar25 & 0xf;
                  auVar46 = vpblendmd_avx512vl(auVar53,auVar61);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  bVar8 = (bool)((byte)(uVar25 >> 1) & 1);
                  sVar29 = CONCAT44((uint)bVar8 * auVar46._4_4_ | (uint)!bVar8 * auVar45._4_4_,
                                    (uint)bVar7 * auVar46._0_4_ | (uint)!bVar7 * auVar45._0_4_);
                  auVar45 = vmovdqa32_avx512vl(auVar53);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  auVar56._0_4_ = (uint)bVar7 * auVar45._0_4_ | !bVar7 * auVar61._0_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar56._4_4_ = (uint)bVar7 * auVar45._4_4_ | !bVar7 * auVar61._4_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar56._8_4_ = (uint)bVar7 * auVar45._8_4_ | !bVar7 * auVar61._8_4_;
                  bVar7 = SUB81(uVar25 >> 3,0);
                  auVar56._12_4_ = (uint)bVar7 * auVar45._12_4_ | !bVar7 * auVar61._12_4_;
                  auVar45 = vpshufd_avx(auVar56,0xaa);
                  auVar46 = vpshufd_avx(auVar55,0xaa);
                  uVar25 = vpcmpgtd_avx512vl(auVar46,auVar45);
                  uVar25 = uVar25 & 0xf;
                  auVar46 = vpblendmd_avx512vl(auVar55,auVar56);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  SVar51.ptr.ptr._0_4_ = (uint)bVar7 * auVar46._0_4_ | (uint)!bVar7 * auVar45._0_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                  SVar51.ptr.ptr._4_4_ = (uint)bVar7 * auVar46._4_4_ | (uint)!bVar7 * auVar45._4_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                  SVar51.dist = (uint)bVar7 * auVar46._8_4_ | (uint)!bVar7 * auVar45._8_4_;
                  bVar7 = SUB81(uVar25 >> 3,0);
                  SVar51._12_4_ = (uint)bVar7 * auVar46._12_4_ | (uint)!bVar7 * auVar45._12_4_;
                  auVar45 = vmovdqa32_avx512vl(auVar55);
                  bVar7 = (bool)((byte)uVar25 & 1);
                  SVar52.ptr.ptr._0_4_ = (uint)bVar7 * auVar45._0_4_ | !bVar7 * auVar56._0_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                  SVar52.ptr.ptr._4_4_ = (uint)bVar7 * auVar45._4_4_ | !bVar7 * auVar56._4_4_;
                  bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                  SVar52.dist = (uint)bVar7 * auVar45._8_4_ | !bVar7 * auVar56._8_4_;
                  bVar7 = SUB81(uVar25 >> 3,0);
                  SVar52._12_4_ = (uint)bVar7 * auVar45._12_4_ | !bVar7 * auVar56._12_4_;
                  *local_1218 = SVar50;
                  local_1218[1] = SVar52;
                  local_1218[2] = SVar51;
                  local_1218 = local_1218 + 3;
                }
              }
            }
          }
        }
        else {
          iVar24 = 6;
        }
      } while (iVar24 == 0);
    } while (iVar24 != 6);
    lVar33 = (ulong)((uint)sVar29 & 0xf) - 8;
    if (lVar33 != 0) {
      uVar30 = sVar29 & 0xfffffffffffffff0;
      local_11a0 = 0;
      do {
        lVar36 = local_11a0 * 0x140;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar67._4_4_ = uVar1;
        auVar67._0_4_ = uVar1;
        auVar67._8_4_ = uVar1;
        auVar67._12_4_ = uVar1;
        auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x90 + lVar36),auVar67,
                                  *(undefined1 (*) [16])(uVar30 + lVar36));
        auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xa0 + lVar36),auVar67,
                                  *(undefined1 (*) [16])(uVar30 + 0x10 + lVar36));
        auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xb0 + lVar36),auVar67,
                                  *(undefined1 (*) [16])(uVar30 + 0x20 + lVar36));
        auVar68 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xc0 + lVar36),auVar67,
                                  *(undefined1 (*) [16])(uVar30 + 0x30 + lVar36));
        auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xd0 + lVar36),auVar67,
                                  *(undefined1 (*) [16])(uVar30 + 0x40 + lVar36));
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xe0 + lVar36),auVar67,
                                  *(undefined1 (*) [16])(uVar30 + 0x50 + lVar36));
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xf0 + lVar36),auVar67,
                                  *(undefined1 (*) [16])(uVar30 + 0x60 + lVar36));
        auVar61 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x100 + lVar36),auVar67,
                                  *(undefined1 (*) [16])(uVar30 + 0x70 + lVar36));
        auVar62 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x110 + lVar36),auVar67,
                                  *(undefined1 (*) [16])(uVar30 + 0x80 + lVar36));
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar72._4_4_ = uVar1;
        auVar72._0_4_ = uVar1;
        auVar72._8_4_ = uVar1;
        auVar72._12_4_ = uVar1;
        auVar53 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
        auVar54 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar80._4_4_ = uVar1;
        auVar80._0_4_ = uVar1;
        auVar80._8_4_ = uVar1;
        auVar80._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar84._4_4_ = uVar1;
        auVar84._0_4_ = uVar1;
        auVar84._8_4_ = uVar1;
        auVar84._12_4_ = uVar1;
        fVar86 = *(float *)(ray + k * 4 + 0x60);
        auVar91._4_4_ = fVar86;
        auVar91._0_4_ = fVar86;
        auVar91._8_4_ = fVar86;
        auVar91._12_4_ = fVar86;
        auVar45 = vsubps_avx(auVar45,auVar72);
        auVar55 = vsubps_avx512vl(auVar46,auVar53);
        auVar56 = vsubps_avx512vl(auVar47,auVar54);
        auVar57 = vsubps_avx512vl(auVar68,auVar72);
        auVar58 = vsubps_avx512vl(auVar58,auVar53);
        auVar59 = vsubps_avx512vl(auVar59,auVar54);
        auVar60 = vsubps_avx512vl(auVar60,auVar72);
        auVar61 = vsubps_avx512vl(auVar61,auVar53);
        auVar62 = vsubps_avx512vl(auVar62,auVar54);
        auVar53 = vsubps_avx512vl(auVar60,auVar45);
        auVar46 = vsubps_avx(auVar61,auVar55);
        auVar47 = vsubps_avx(auVar62,auVar56);
        auVar54 = vsubps_avx512vl(auVar45,auVar57);
        auVar63 = vsubps_avx512vl(auVar55,auVar58);
        auVar64 = vsubps_avx512vl(auVar56,auVar59);
        auVar65 = vsubps_avx512vl(auVar57,auVar60);
        auVar66 = vsubps_avx512vl(auVar58,auVar61);
        auVar67 = vsubps_avx512vl(auVar59,auVar62);
        auVar68 = vaddps_avx512vl(auVar60,auVar45);
        auVar82._0_4_ = auVar61._0_4_ + auVar55._0_4_;
        auVar82._4_4_ = auVar61._4_4_ + auVar55._4_4_;
        auVar82._8_4_ = auVar61._8_4_ + auVar55._8_4_;
        auVar82._12_4_ = auVar61._12_4_ + auVar55._12_4_;
        auVar69 = vaddps_avx512vl(auVar62,auVar56);
        auVar70 = vmulps_avx512vl(auVar82,auVar47);
        auVar70 = vfmsub231ps_avx512vl(auVar70,auVar46,auVar69);
        auVar69 = vmulps_avx512vl(auVar69,auVar53);
        auVar69 = vfmsub231ps_avx512vl(auVar69,auVar47,auVar68);
        auVar78._0_4_ = auVar46._0_4_ * auVar68._0_4_;
        auVar78._4_4_ = auVar46._4_4_ * auVar68._4_4_;
        auVar78._8_4_ = auVar46._8_4_ * auVar68._8_4_;
        auVar78._12_4_ = auVar46._12_4_ * auVar68._12_4_;
        auVar68 = vfmsub231ps_fma(auVar78,auVar53,auVar82);
        auVar79._0_4_ = fVar86 * auVar68._0_4_;
        auVar79._4_4_ = fVar86 * auVar68._4_4_;
        auVar79._8_4_ = fVar86 * auVar68._8_4_;
        auVar79._12_4_ = fVar86 * auVar68._12_4_;
        auVar68 = vfmadd231ps_avx512vl(auVar79,auVar84,auVar69);
        tNear.field_0 =
             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
             vfmadd231ps_avx512vl(auVar68,auVar80,auVar70);
        auVar68 = vaddps_avx512vl(auVar45,auVar57);
        auVar69 = vaddps_avx512vl(auVar55,auVar58);
        auVar70 = vaddps_avx512vl(auVar56,auVar59);
        auVar71 = vmulps_avx512vl(auVar69,auVar64);
        auVar71 = vfmsub231ps_avx512vl(auVar71,auVar63,auVar70);
        auVar70 = vmulps_avx512vl(auVar70,auVar54);
        auVar70 = vfmsub231ps_avx512vl(auVar70,auVar64,auVar68);
        auVar68 = vmulps_avx512vl(auVar68,auVar63);
        auVar68 = vfmsub231ps_avx512vl(auVar68,auVar54,auVar69);
        auVar83._0_4_ = fVar86 * auVar68._0_4_;
        auVar83._4_4_ = fVar86 * auVar68._4_4_;
        auVar83._8_4_ = fVar86 * auVar68._8_4_;
        auVar83._12_4_ = fVar86 * auVar68._12_4_;
        auVar68 = vfmadd231ps_avx512vl(auVar83,auVar84,auVar70);
        auVar68 = vfmadd231ps_avx512vl(auVar68,auVar80,auVar71);
        auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar76 = ZEXT1664(auVar72);
        auVar60 = vaddps_avx512vl(auVar57,auVar60);
        auVar58 = vaddps_avx512vl(auVar58,auVar61);
        auVar59 = vaddps_avx512vl(auVar59,auVar62);
        auVar61 = vmulps_avx512vl(auVar58,auVar67);
        auVar61 = vfmsub231ps_avx512vl(auVar61,auVar66,auVar59);
        auVar102._0_4_ = auVar59._0_4_ * auVar65._0_4_;
        auVar102._4_4_ = auVar59._4_4_ * auVar65._4_4_;
        auVar102._8_4_ = auVar59._8_4_ * auVar65._8_4_;
        auVar102._12_4_ = auVar59._12_4_ * auVar65._12_4_;
        auVar59 = vfmsub231ps_avx512vl(auVar102,auVar67,auVar60);
        auVar60 = vmulps_avx512vl(auVar60,auVar66);
        auVar58 = vfmsub231ps_avx512vl(auVar60,auVar65,auVar58);
        auVar58 = vmulps_avx512vl(auVar58,auVar91);
        auVar58 = vfmadd231ps_avx512vl(auVar58,auVar84,auVar59);
        auVar58 = vfmadd231ps_avx512vl(auVar58,auVar80,auVar61);
        auVar101._0_4_ = tNear.field_0._0_4_ + auVar68._0_4_;
        auVar101._4_4_ = tNear.field_0._4_4_ + auVar68._4_4_;
        auVar101._8_4_ = tNear.field_0._8_4_ + auVar68._8_4_;
        auVar101._12_4_ = tNear.field_0._12_4_ + auVar68._12_4_;
        auVar59 = vaddps_avx512vl(auVar58,auVar101);
        auVar69._8_4_ = 0x7fffffff;
        auVar69._0_8_ = 0x7fffffff7fffffff;
        auVar69._12_4_ = 0x7fffffff;
        auVar60 = vandps_avx512vl(auVar59,auVar69);
        auVar70._8_4_ = 0x34000000;
        auVar70._0_8_ = 0x3400000034000000;
        auVar70._12_4_ = 0x34000000;
        auVar61 = vmulps_avx512vl(auVar60,auVar70);
        auVar62 = vminps_avx512vl((undefined1  [16])tNear.field_0,auVar68);
        auVar62 = vminps_avx512vl(auVar62,auVar58);
        auVar71._8_4_ = 0x80000000;
        auVar71._0_8_ = 0x8000000080000000;
        auVar71._12_4_ = 0x80000000;
        auVar57 = vxorps_avx512vl(auVar61,auVar71);
        uVar10 = vcmpps_avx512vl(auVar62,auVar57,5);
        auVar62 = vmaxps_avx512vl((undefined1  [16])tNear.field_0,auVar68);
        auVar58 = vmaxps_avx512vl(auVar62,auVar58);
        uVar11 = vcmpps_avx512vl(auVar58,auVar61,2);
        bVar27 = ((byte)uVar10 | (byte)uVar11) & 0xf;
        if (bVar27 != 0) {
          auVar58 = vmulps_avx512vl(auVar63,auVar47);
          auVar61 = vmulps_avx512vl(auVar53,auVar64);
          auVar62 = vmulps_avx512vl(auVar54,auVar46);
          auVar57 = vmulps_avx512vl(auVar66,auVar64);
          auVar69 = vmulps_avx512vl(auVar54,auVar67);
          auVar70 = vmulps_avx512vl(auVar65,auVar63);
          auVar46 = vfmsub213ps_avx512vl(auVar46,auVar64,auVar58);
          auVar47 = vfmsub213ps_avx512vl(auVar47,auVar54,auVar61);
          auVar53 = vfmsub213ps_avx512vl(auVar53,auVar63,auVar62);
          auVar63 = vfmsub213ps_avx512vl(auVar67,auVar63,auVar57);
          auVar64 = vfmsub213ps_avx512vl(auVar65,auVar64,auVar69);
          auVar54 = vfmsub213ps_avx512vl(auVar66,auVar54,auVar70);
          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar58 = vandps_avx512vl(auVar58,auVar65);
          auVar57 = vandps_avx512vl(auVar57,auVar65);
          uVar31 = vcmpps_avx512vl(auVar58,auVar57,1);
          auVar58 = vandps_avx512vl(auVar61,auVar65);
          auVar61 = vandps_avx512vl(auVar69,auVar65);
          uVar38 = vcmpps_avx512vl(auVar58,auVar61,1);
          auVar58 = vandps_avx512vl(auVar62,auVar65);
          auVar61 = vandps_avx512vl(auVar70,auVar65);
          uVar34 = vcmpps_avx512vl(auVar58,auVar61,1);
          bVar7 = (bool)((byte)uVar31 & 1);
          local_1088._0_4_ = (uint)bVar7 * auVar46._0_4_ | (uint)!bVar7 * auVar63._0_4_;
          bVar7 = (bool)((byte)(uVar31 >> 1) & 1);
          local_1088._4_4_ = (uint)bVar7 * auVar46._4_4_ | (uint)!bVar7 * auVar63._4_4_;
          bVar7 = (bool)((byte)(uVar31 >> 2) & 1);
          local_1088._8_4_ = (uint)bVar7 * auVar46._8_4_ | (uint)!bVar7 * auVar63._8_4_;
          bVar7 = (bool)((byte)(uVar31 >> 3) & 1);
          local_1088._12_4_ = (uint)bVar7 * auVar46._12_4_ | (uint)!bVar7 * auVar63._12_4_;
          bVar7 = (bool)((byte)uVar38 & 1);
          local_1078._0_4_ = (uint)bVar7 * auVar47._0_4_ | (uint)!bVar7 * auVar64._0_4_;
          bVar7 = (bool)((byte)(uVar38 >> 1) & 1);
          local_1078._4_4_ = (uint)bVar7 * auVar47._4_4_ | (uint)!bVar7 * auVar64._4_4_;
          bVar7 = (bool)((byte)(uVar38 >> 2) & 1);
          local_1078._8_4_ = (uint)bVar7 * auVar47._8_4_ | (uint)!bVar7 * auVar64._8_4_;
          bVar7 = (bool)((byte)(uVar38 >> 3) & 1);
          local_1078._12_4_ = (uint)bVar7 * auVar47._12_4_ | (uint)!bVar7 * auVar64._12_4_;
          bVar7 = (bool)((byte)uVar34 & 1);
          local_1068[0] = (float)((uint)bVar7 * auVar53._0_4_ | (uint)!bVar7 * auVar54._0_4_);
          bVar7 = (bool)((byte)(uVar34 >> 1) & 1);
          local_1068[1] = (float)((uint)bVar7 * auVar53._4_4_ | (uint)!bVar7 * auVar54._4_4_);
          bVar7 = (bool)((byte)(uVar34 >> 2) & 1);
          local_1068[2] = (float)((uint)bVar7 * auVar53._8_4_ | (uint)!bVar7 * auVar54._8_4_);
          bVar7 = (bool)((byte)(uVar34 >> 3) & 1);
          local_1068[3] = (float)((uint)bVar7 * auVar53._12_4_ | (uint)!bVar7 * auVar54._12_4_);
          auVar92._0_4_ = fVar86 * local_1068[0];
          auVar92._4_4_ = fVar86 * local_1068[1];
          auVar92._8_4_ = fVar86 * local_1068[2];
          auVar92._12_4_ = fVar86 * local_1068[3];
          auVar46 = vfmadd213ps_fma(auVar84,local_1078,auVar92);
          auVar46 = vfmadd213ps_fma(auVar80,local_1088,auVar46);
          auVar81._0_4_ = auVar46._0_4_ + auVar46._0_4_;
          auVar81._4_4_ = auVar46._4_4_ + auVar46._4_4_;
          auVar81._8_4_ = auVar46._8_4_ + auVar46._8_4_;
          auVar81._12_4_ = auVar46._12_4_ + auVar46._12_4_;
          auVar85._0_4_ = auVar56._0_4_ * local_1068[0];
          auVar85._4_4_ = auVar56._4_4_ * local_1068[1];
          auVar85._8_4_ = auVar56._8_4_ * local_1068[2];
          auVar85._12_4_ = auVar56._12_4_ * local_1068[3];
          auVar46 = vfmadd213ps_fma(auVar55,local_1078,auVar85);
          auVar46 = vfmadd213ps_fma(auVar45,local_1088,auVar46);
          auVar45 = vrcp14ps_avx512vl(auVar81);
          auVar14._8_4_ = 0x3f800000;
          auVar14._0_8_ = &DAT_3f8000003f800000;
          auVar14._12_4_ = 0x3f800000;
          auVar47 = vfnmadd213ps_avx512vl(auVar45,auVar81,auVar14);
          auVar45 = vfmadd132ps_fma(auVar47,auVar45,auVar45);
          local_1098._0_4_ = auVar45._0_4_ * (auVar46._0_4_ + auVar46._0_4_);
          local_1098._4_4_ = auVar45._4_4_ * (auVar46._4_4_ + auVar46._4_4_);
          local_1098._8_4_ = auVar45._8_4_ * (auVar46._8_4_ + auVar46._8_4_);
          local_1098._12_4_ = auVar45._12_4_ * (auVar46._12_4_ + auVar46._12_4_);
          auVar100 = ZEXT1664(local_1098);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar15._4_4_ = uVar1;
          auVar15._0_4_ = uVar1;
          auVar15._8_4_ = uVar1;
          auVar15._12_4_ = uVar1;
          uVar10 = vcmpps_avx512vl(local_1098,auVar15,2);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar16._4_4_ = uVar1;
          auVar16._0_4_ = uVar1;
          auVar16._8_4_ = uVar1;
          auVar16._12_4_ = uVar1;
          uVar11 = vcmpps_avx512vl(local_1098,auVar16,0xd);
          bVar27 = (byte)uVar10 & (byte)uVar11 & bVar27;
          if (bVar27 != 0) {
            uVar10 = vcmpps_avx512vl(auVar81,_DAT_01feba10,4);
            bVar27 = bVar27 & (byte)uVar10;
            uVar37 = (uint)bVar27;
            if (bVar27 != 0) {
              pSVar4 = context->scene;
              auVar17._8_4_ = 0x219392ef;
              auVar17._0_8_ = 0x219392ef219392ef;
              auVar17._12_4_ = 0x219392ef;
              uVar31 = vcmpps_avx512vl(auVar60,auVar17,5);
              auVar46 = vrcp14ps_avx512vl(auVar59);
              auVar77._8_4_ = 0x3f800000;
              auVar77._0_8_ = &DAT_3f8000003f800000;
              auVar77._12_4_ = 0x3f800000;
              auVar45 = vfnmadd213ps_fma(auVar59,auVar46,auVar77);
              auVar45 = vfmadd132ps_avx512vl(auVar45,auVar46,auVar46);
              fVar89 = (float)((uint)((byte)uVar31 & 1) * auVar45._0_4_);
              fVar88 = (float)((uint)((byte)(uVar31 >> 1) & 1) * auVar45._4_4_);
              fVar87 = (float)((uint)((byte)(uVar31 >> 2) & 1) * auVar45._8_4_);
              fVar86 = (float)((uint)((byte)(uVar31 >> 3) & 1) * auVar45._12_4_);
              auVar74._0_4_ = fVar89 * tNear.field_0._0_4_;
              auVar74._4_4_ = fVar88 * tNear.field_0._4_4_;
              auVar74._8_4_ = fVar87 * tNear.field_0._8_4_;
              auVar74._12_4_ = fVar86 * tNear.field_0._12_4_;
              local_10b8 = vminps_avx(auVar74,auVar77);
              auVar75._0_4_ = fVar89 * auVar68._0_4_;
              auVar75._4_4_ = fVar88 * auVar68._4_4_;
              auVar75._8_4_ = fVar87 * auVar68._8_4_;
              auVar75._12_4_ = fVar86 * auVar68._12_4_;
              local_10a8 = vminps_avx(auVar75,auVar77);
              lVar36 = lVar36 + uVar30;
              auVar45 = vblendmps_avx512vl(auVar72,local_1098);
              auVar73._0_4_ =
                   (uint)(bVar27 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar27 & 1) * local_10a8._0_4_
              ;
              bVar7 = (bool)(bVar27 >> 1 & 1);
              auVar73._4_4_ = (uint)bVar7 * auVar45._4_4_ | (uint)!bVar7 * local_10a8._4_4_;
              bVar7 = (bool)(bVar27 >> 2 & 1);
              auVar73._8_4_ = (uint)bVar7 * auVar45._8_4_ | (uint)!bVar7 * local_10a8._8_4_;
              auVar73._12_4_ =
                   (uint)(bVar27 >> 3) * auVar45._12_4_ |
                   (uint)!(bool)(bVar27 >> 3) * local_10a8._12_4_;
              auVar45 = vshufps_avx(auVar73,auVar73,0xb1);
              auVar45 = vminps_avx(auVar45,auVar73);
              auVar46 = vshufpd_avx(auVar45,auVar45,1);
              auVar45 = vminps_avx(auVar46,auVar45);
              uVar10 = vcmpps_avx512vl(auVar73,auVar45,0);
              bVar26 = (byte)uVar10 & bVar27;
              if (((byte)uVar10 & bVar27) == 0) {
                bVar26 = bVar27;
              }
              uVar31 = 0;
              for (uVar38 = (ulong)bVar26; (uVar38 & 1) == 0;
                  uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                uVar31 = uVar31 + 1;
              }
              do {
                uVar3 = *(uint *)(lVar36 + 0x120 + uVar31 * 4);
                pGVar5 = (pSVar4->geometries).items[uVar3].ptr;
                auVar45 = auVar73;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar27 = ~(byte)(1 << ((uint)uVar31 & 0x1f)) & (byte)uVar37;
LAB_0076774d:
                  uVar37 = (uint)bVar27;
                  bVar7 = true;
                }
                else {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    uVar1 = *(undefined4 *)(local_10b8 + uVar31 * 4);
                    local_fd8._4_4_ = uVar1;
                    local_fd8._0_4_ = uVar1;
                    local_fd8._8_4_ = uVar1;
                    local_fd8._12_4_ = uVar1;
                    local_fc8 = *(undefined4 *)(local_10a8 + uVar31 * 4);
                    local_fa8 = vpbroadcastd_avx512vl();
                    uVar1 = *(undefined4 *)(lVar36 + 0x130 + uVar31 * 4);
                    local_fb8._4_4_ = uVar1;
                    local_fb8._0_4_ = uVar1;
                    local_fb8._8_4_ = uVar1;
                    local_fb8._12_4_ = uVar1;
                    uVar1 = *(undefined4 *)(local_1088 + uVar31 * 4);
                    fVar86 = local_1068[uVar31 - 4];
                    local_ff8._4_4_ = fVar86;
                    local_ff8._0_4_ = fVar86;
                    local_ff8._8_4_ = fVar86;
                    local_ff8._12_4_ = fVar86;
                    fVar86 = local_1068[uVar31];
                    local_fe8._4_4_ = fVar86;
                    local_fe8._0_4_ = fVar86;
                    local_fe8._8_4_ = fVar86;
                    local_fe8._12_4_ = fVar86;
                    local_1008[0] = (RTCHitN)(char)uVar1;
                    local_1008[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                    local_1008[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                    local_1008[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                    local_1008[4] = (RTCHitN)(char)uVar1;
                    local_1008[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                    local_1008[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                    local_1008[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                    local_1008[8] = (RTCHitN)(char)uVar1;
                    local_1008[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                    local_1008[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                    local_1008[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                    local_1008[0xc] = (RTCHitN)(char)uVar1;
                    local_1008[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                    local_1008[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                    local_1008[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                    uStack_fc4 = local_fc8;
                    uStack_fc0 = local_fc8;
                    uStack_fbc = local_fc8;
                    vpcmpeqd_avx2(ZEXT1632(local_fd8),ZEXT1632(local_fd8));
                    uStack_f94 = context->user->instID[0];
                    local_f98 = uStack_f94;
                    uStack_f90 = uStack_f94;
                    uStack_f8c = uStack_f94;
                    uStack_f88 = context->user->instPrimID[0];
                    uStack_f84 = uStack_f88;
                    uStack_f80 = uStack_f88;
                    uStack_f7c = uStack_f88;
                    uVar12 = *(uint *)(ray + k * 4 + 0x80);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1098 + uVar31 * 4);
                    local_11e8 = local_1058._0_8_;
                    uStack_11e0 = local_1058._8_8_;
                    args.valid = (int *)&local_11e8;
                    args.geometryUserPtr = pGVar5->userPtr;
                    args.context = context->user;
                    args.hit = local_1008;
                    args.N = 4;
                    auVar45 = auVar100._0_16_;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      local_11d8 = lVar33;
                      (*pGVar5->intersectionFilterN)(&args);
                      auVar100 = ZEXT1664(auVar45);
                      lVar33 = local_11d8;
                    }
                    auVar21._8_8_ = uStack_11e0;
                    auVar21._0_8_ = local_11e8;
                    uVar38 = vptestmd_avx512vl(auVar21,auVar21);
                    if ((uVar38 & 0xf) == 0) {
LAB_00767a71:
                      auVar45 = ZEXT416(uVar12);
                      *(uint *)(ray + k * 4 + 0x80) = uVar12;
                    }
                    else {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var6)(&args);
                        auVar100 = ZEXT1664(auVar45);
                      }
                      auVar22._8_8_ = uStack_11e0;
                      auVar22._0_8_ = local_11e8;
                      uVar38 = vptestmd_avx512vl(auVar22,auVar22);
                      uVar38 = uVar38 & 0xf;
                      bVar27 = (byte)uVar38;
                      if (bVar27 == 0) goto LAB_00767a71;
                      iVar24 = *(int *)(args.hit + 4);
                      iVar19 = *(int *)(args.hit + 8);
                      iVar20 = *(int *)(args.hit + 0xc);
                      bVar7 = (bool)((byte)(uVar38 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar38 >> 2) & 1);
                      bVar9 = SUB81(uVar38 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar27 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar7 * iVar24 | (uint)!bVar7 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar8 * iVar19 | (uint)!bVar8 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar9 * iVar20 | (uint)!bVar9 * *(int *)(args.ray + 0xcc);
                      iVar24 = *(int *)(args.hit + 0x14);
                      iVar19 = *(int *)(args.hit + 0x18);
                      iVar20 = *(int *)(args.hit + 0x1c);
                      bVar7 = (bool)((byte)(uVar38 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar38 >> 2) & 1);
                      bVar9 = SUB81(uVar38 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar7 * iVar24 | (uint)!bVar7 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar8 * iVar19 | (uint)!bVar8 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar9 * iVar20 | (uint)!bVar9 * *(int *)(args.ray + 0xdc);
                      iVar24 = *(int *)(args.hit + 0x24);
                      iVar19 = *(int *)(args.hit + 0x28);
                      iVar20 = *(int *)(args.hit + 0x2c);
                      bVar7 = (bool)((byte)(uVar38 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar38 >> 2) & 1);
                      bVar9 = SUB81(uVar38 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar7 * iVar24 | (uint)!bVar7 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar8 * iVar19 | (uint)!bVar8 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar9 * iVar20 | (uint)!bVar9 * *(int *)(args.ray + 0xec);
                      iVar24 = *(int *)(args.hit + 0x34);
                      iVar19 = *(int *)(args.hit + 0x38);
                      iVar20 = *(int *)(args.hit + 0x3c);
                      bVar7 = (bool)((byte)(uVar38 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar38 >> 2) & 1);
                      bVar9 = SUB81(uVar38 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar7 * iVar24 | (uint)!bVar7 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar8 * iVar19 | (uint)!bVar8 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar9 * iVar20 | (uint)!bVar9 * *(int *)(args.ray + 0xfc);
                      iVar24 = *(int *)(args.hit + 0x44);
                      iVar19 = *(int *)(args.hit + 0x48);
                      iVar20 = *(int *)(args.hit + 0x4c);
                      bVar7 = (bool)((byte)(uVar38 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar38 >> 2) & 1);
                      bVar9 = SUB81(uVar38 >> 3,0);
                      *(uint *)(args.ray + 0x100) =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0x100);
                      *(uint *)(args.ray + 0x104) =
                           (uint)bVar7 * iVar24 | (uint)!bVar7 * *(int *)(args.ray + 0x104);
                      *(uint *)(args.ray + 0x108) =
                           (uint)bVar8 * iVar19 | (uint)!bVar8 * *(int *)(args.ray + 0x108);
                      *(uint *)(args.ray + 0x10c) =
                           (uint)bVar9 * iVar20 | (uint)!bVar9 * *(int *)(args.ray + 0x10c);
                      auVar45 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar45;
                      auVar45 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar45;
                      auVar45 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar45;
                      auVar45 = *(undefined1 (*) [16])(args.hit + 0x80);
                      auVar46 = vmovdqa32_avx512vl(auVar45);
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar46;
                    }
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar76 = ZEXT1664(auVar46);
                    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                    auVar18._4_4_ = uVar1;
                    auVar18._0_4_ = uVar1;
                    auVar18._8_4_ = uVar1;
                    auVar18._12_4_ = uVar1;
                    uVar10 = vcmpps_avx512vl(auVar100._0_16_,auVar18,2);
                    bVar27 = ~(byte)(1 << ((uint)uVar31 & 0x1f)) & (byte)uVar37 & (byte)uVar10;
                    goto LAB_0076774d;
                  }
                  bVar7 = false;
                }
                if (!bVar7) {
                  uVar1 = *(undefined4 *)(local_10b8 + uVar31 * 4);
                  uVar2 = *(undefined4 *)(local_10a8 + uVar31 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1098 + uVar31 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1088 + uVar31 * 4);
                  *(float *)(ray + k * 4 + 0xd0) = local_1068[uVar31 - 4];
                  *(float *)(ray + k * 4 + 0xe0) = local_1068[uVar31];
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)(lVar36 + 0x130 + uVar31 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar3;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                bVar27 = (byte)uVar37;
                if (bVar27 == 0) break;
                auVar46 = vblendmps_avx512vl(auVar76._0_16_,auVar100._0_16_);
                auVar73._0_4_ =
                     (uint)(bVar27 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar45._0_4_;
                bVar7 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar73._4_4_ = (uint)bVar7 * auVar46._4_4_ | (uint)!bVar7 * auVar45._4_4_;
                bVar7 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar73._8_4_ = (uint)bVar7 * auVar46._8_4_ | (uint)!bVar7 * auVar45._8_4_;
                auVar73._12_4_ =
                     (uVar37 >> 3) * auVar46._12_4_ | (uint)!SUB41(uVar37 >> 3,0) * auVar45._12_4_;
                auVar45 = vshufps_avx(auVar73,auVar73,0xb1);
                auVar45 = vminps_avx(auVar45,auVar73);
                auVar46 = vshufpd_avx(auVar45,auVar45,1);
                auVar45 = vminps_avx(auVar46,auVar45);
                uVar10 = vcmpps_avx512vl(auVar73,auVar45,0);
                bVar27 = (byte)uVar10 & bVar27;
                uVar3 = uVar37;
                if (bVar27 != 0) {
                  uVar3 = (uint)bVar27;
                }
                uVar12 = 0;
                for (; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
                  uVar12 = uVar12 + 1;
                }
                uVar31 = (ulong)uVar12;
              } while( true );
            }
          }
        }
        local_11a0 = local_11a0 + 1;
      } while (local_11a0 != lVar33);
    }
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar76 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
    auVar100 = ZEXT1664(local_1048);
    uVar30 = local_11b0;
    uVar31 = local_11c8;
    uVar38 = local_11d0;
    uVar34 = local_11b8;
    uVar35 = local_11c0;
    fVar86 = local_1018;
    fVar87 = fStack_1014;
    fVar88 = fStack_1010;
    fVar89 = fStack_100c;
    fVar90 = local_1028;
    fVar93 = fStack_1024;
    fVar94 = fStack_1020;
    fVar95 = fStack_101c;
    fVar96 = local_1038;
    fVar97 = fStack_1034;
    fVar98 = fStack_1030;
    fVar99 = fStack_102c;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }